

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sstring_view_archive.hpp
# Opt level: O3

void pstore::serialize::serializer<pstore::sstring_view<std::shared_ptr<char_const>>,void>::
     readsv<pstore::serialize::archive::database_reader&>(database_reader *archive,value_type *str)

{
  size_t distance;
  _func_int **local_38;
  __uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  _Stack_30;
  
  distance = string_helper::read_length<pstore::serialize::archive::database_reader&>(archive);
  database::getro<char,void>
            ((database *)&stack0xffffffffffffffc8,(typed_address<char>)archive->db_,
             (archive->addr_).a_);
  (str->ptr_).super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_38;
  (str->ptr_).super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       _Stack_30._M_t.
       super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
       .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl;
  str->size_ = distance;
  address::operator+=(&archive->addr_,distance);
  return;
}

Assistant:

static void readsv (DBReader && archive, value_type & str) {
                std::size_t const length =
                    string_helper::read_length (std::forward<DBReader> (archive));
                new (&str) value_type (read_string_view (
                    archive.get_db (), typed_address<char> (archive.get_address ()), length));
                archive.skip (length);
            }